

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host.c
# Opt level: O0

axbStatus_t op_vec_dot(axbVec_s *x,axbVec_s *y,axbScalar_s *dot,void *aux_data)

{
  ulong local_50;
  size_t i;
  double d;
  double *d_dot;
  double *d_y;
  double *d_x;
  void *aux_data_local;
  axbScalar_s *dot_local;
  axbVec_s *y_local;
  axbVec_s *x_local;
  
  i = 0;
  for (local_50 = 0; local_50 < y->size; local_50 = local_50 + 1) {
    i = (size_t)(*(double *)((long)x->data + local_50 * 8) *
                 *(double *)((long)y->data + local_50 * 8) + (double)i);
  }
  *(size_t *)dot->data = i;
  return 0;
}

Assistant:

static axbStatus_t op_vec_dot(const struct axbVec_s *x, const struct axbVec_s *y, struct axbScalar_s *dot, void *aux_data)
{
  (void)aux_data;

  const double *d_x   = (const double*)x->data;
  const double *d_y   = (const double*)y->data;
        double *d_dot = (double*)dot->data;

  double d = 0;
  for (size_t i=0; i<y->size; ++i) d += d_x[i] * d_y[i];
  *d_dot = d;

  return 0;
}